

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_chi2_test<trng::hypergeometric_dist>(hypergeometric_dist *d)

{
  double *pdVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *__src;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  parameter_type P;
  vector<double,_std::allocator<double>_> p;
  vector<int,_std::allocator<int>_> count;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  double local_c8;
  AssertionHandler local_b8;
  StringRef local_70;
  lcg64_shift local_60;
  StringRef local_48;
  SourceLineInfo local_38;
  
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  iVar6 = (d->P).x_min;
  uVar10 = (ulong)iVar6;
  iVar6 = iVar6 + -1;
  do {
    iVar12 = (int)uVar10;
    if ((d->P).x_max < iVar12) goto LAB_0025a851;
    iVar5 = (d->P).x_min;
    local_b8.m_assertionInfo.macroName.m_start = (char *)0x0;
    if (iVar5 <= iVar12) {
      if (iVar12 == iVar5) {
        local_b8.m_assertionInfo.macroName.m_start =
             (char *)*(d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
      }
      else {
        pdVar2 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_b8.m_assertionInfo.macroName.m_start =
             (char *)(pdVar2[uVar10 - (long)iVar5] - pdVar2[(uVar10 - 1) - (long)iVar5]);
      }
    }
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)local_b8.m_assertionInfo.macroName.m_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar5 = (d->P).x_min;
    if (iVar12 < iVar5) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (iVar12 <= (d->P).x_max) {
        bVar3 = 0.99 < (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10 - (long)iVar5];
      }
    }
    iVar6 = iVar6 + 1;
    uVar10 = uVar10 + 1;
  } while (!bVar3);
  uVar10 = (ulong)((uint)(byte)(bVar3 + 1) + iVar6);
LAB_0025a851:
  iVar6 = (d->P).x_max;
  iVar12 = (int)uVar10;
  if (iVar12 < iVar6) {
    dVar13 = 0.0;
    iVar5 = (d->P).x_min;
    if (iVar5 <= iVar12) {
      if (iVar6 < iVar12) {
        dVar13 = 1.0;
      }
      else {
        dVar13 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar12 - iVar5];
      }
    }
    local_b8.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar13);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = (double)local_b8.m_assertionInfo.macroName.m_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar12 = (int)((ulong)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  local_b8.m_assertionInfo.macroName.m_start =
       (char *)((ulong)local_b8.m_assertionInfo.macroName.m_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)iVar12,(value_type_conflict *)&local_b8,(allocator_type *)&local_60);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&local_60,100,P);
  iVar12 = iVar12 + -1;
  iVar6 = 10000;
  do {
    iVar4 = trng::hypergeometric_dist::operator()(d,&local_60);
    iVar4 = iVar4 - (d->P).x_min;
    iVar5 = iVar12;
    if (iVar4 <= iVar12) {
      iVar5 = iVar4;
    }
    local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar5] = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar5] + 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  do {
    if ((ulong)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x11) break;
    piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar8 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar7 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar8 = piVar7;
        if (*piVar9 <= *piVar7) {
          piVar8 = piVar9;
        }
        piVar7 = piVar7 + 1;
        piVar9 = piVar8;
      } while (piVar7 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    iVar6 = *piVar8;
    if (8 < iVar6) break;
    lVar11 = (long)piVar8 -
             (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pdVar1 = (double *)
             ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar11 * 2);
    __src = pdVar1 + 1;
    local_c8 = *pdVar1;
    iVar12 = *piVar8;
    if (__src != local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar11 * 2),__src,
              (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    piVar7 = (int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar11 + 4);
    if (piVar7 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove((void *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar11),piVar7,
              (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar7);
    }
    local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    piVar7 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar8 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar7 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar8 = piVar7;
        if (*piVar9 <= *piVar7) {
          piVar8 = piVar9;
        }
        piVar7 = piVar7 + 1;
        piVar9 = piVar8;
      } while (piVar7 != local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    *(double *)
     ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start +
     ((long)piVar8 -
     (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) * 2) =
         local_c8 +
         *(double *)
          ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
          ((long)piVar8 -
          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) * 2);
    *piVar8 = *piVar8 + iVar12;
  } while (iVar6 < 9);
  local_c8 = chi_percentil(&local_f8,&local_e0);
  local_70.m_start = "REQUIRE";
  local_70.m_size = 7;
  local_38.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_38.line = 0x11c;
  Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler(&local_b8,&local_70,&local_38,local_48,Normal);
  local_70.m_start =
       (char *)(CONCAT71(local_70.m_start._1_7_,-(local_c8 < 0.99) & -(0.01 < local_c8)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&local_b8,(ExprLhs<bool> *)&local_70);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}